

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O1

bool __thiscall gjkepa2_impl::GJK::EncloseOrigin(GJK *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  sSimplex *psVar4;
  sSV *psVar5;
  sSV *psVar6;
  sSV *psVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  bool bVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  float fVar25;
  float fVar26;
  float fVar27;
  cbtVector3 n;
  cbtVector3 p;
  cbtVector3 local_b8;
  cbtVector3 local_a8;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  cbtVector3 local_38;
  
  psVar4 = this->m_simplex;
  uVar13 = psVar4->rank;
  switch(uVar13) {
  case 1:
    uVar15 = 0;
    bVar11 = false;
    break;
  case 2:
    psVar5 = psVar4->c[0];
    psVar6 = psVar4->c[1];
    fVar1 = (psVar6->w).m_floats[0] - (psVar5->w).m_floats[0];
    auVar22 = ZEXT464((uint)fVar1);
    fVar2 = (psVar6->w).m_floats[1] - (psVar5->w).m_floats[1];
    auVar23 = ZEXT464((uint)fVar2);
    fVar3 = (psVar6->w).m_floats[2] - (psVar5->w).m_floats[2];
    auVar24 = ZEXT464((uint)fVar3);
    fVar25 = -fVar3;
    fVar26 = -fVar1;
    fVar27 = -fVar2;
    uVar15 = 0;
    bVar11 = false;
    local_48 = ZEXT416((uint)fVar1);
    local_58 = ZEXT416((uint)fVar2);
    local_68 = ZEXT416((uint)fVar3);
    uStack_74 = 0x80000000;
    uStack_70 = 0x80000000;
    uStack_6c = 0x80000000;
    uStack_84 = 0x80000000;
    uStack_80 = 0x80000000;
    uStack_7c = 0x80000000;
    uStack_94 = 0x80000000;
    uStack_90 = 0x80000000;
    uStack_8c = 0x80000000;
    local_98 = fVar27;
    local_88 = fVar26;
    local_78 = fVar25;
    do {
      local_b8.m_floats = (cbtScalar  [4])ZEXT816(0);
      local_b8.m_floats[uVar15] = 1.0;
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(local_b8.m_floats[1] * fVar25)),auVar23._0_16_,
                                ZEXT416((uint)local_b8.m_floats[2]));
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * local_b8.m_floats[2])),auVar24._0_16_,
                                ZEXT416((uint)local_b8.m_floats[0]));
      auVar17 = vinsertps_avx(auVar17,auVar20,0x10);
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * local_b8.m_floats[0])),auVar22._0_16_,
                                ZEXT416((uint)local_b8.m_floats[1]));
      local_a8.m_floats = (cbtScalar  [4])vinsertps_avx(auVar17,auVar20,0x28);
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(local_a8.m_floats[1] * local_a8.m_floats[1])),
                                ZEXT416((uint)local_a8.m_floats[0]),
                                ZEXT416((uint)local_a8.m_floats[0]));
      auVar17 = vfmadd213ss_fma(ZEXT416((uint)local_a8.m_floats[2]),
                                ZEXT416((uint)local_a8.m_floats[2]),auVar17);
      if (0.0 < auVar17._0_4_) {
        psVar4 = this->m_simplex;
        uVar13 = psVar4->rank;
        psVar4->p[uVar13] = 0.0;
        uVar14 = this->m_nfree - 1;
        this->m_nfree = uVar14;
        psVar5 = this->m_free[uVar14];
        psVar4->c[uVar13] = psVar5;
        psVar4->rank = uVar13 + 1;
        getsupport(this,&local_a8,psVar5);
        bVar12 = EncloseOrigin(this);
        if (bVar12) goto LAB_0090ff96;
        psVar4 = this->m_simplex;
        uVar13 = psVar4->rank - 1;
        psVar4->rank = uVar13;
        psVar5 = psVar4->c[uVar13];
        uVar13 = this->m_nfree;
        this->m_nfree = uVar13 + 1;
        this->m_free[uVar13] = psVar5;
        psVar4 = this->m_simplex;
        auVar18._0_4_ = -local_a8.m_floats[2];
        auVar18._4_4_ = 0x80000000;
        auVar18._8_4_ = 0x80000000;
        auVar18._12_4_ = 0x80000000;
        auVar21._0_8_ = local_a8.m_floats._0_8_ ^ 0x8000000080000000;
        auVar21._8_4_ = -local_a8.m_floats[2];
        auVar21._12_4_ = -local_a8.m_floats[3];
        local_38.m_floats = (cbtScalar  [4])vinsertps_avx(auVar21,auVar18,0x28);
        uVar14 = psVar4->rank;
        psVar4->p[uVar14] = 0.0;
        this->m_nfree = uVar13;
        psVar4->c[uVar14] = psVar5;
        psVar4->rank = uVar14 + 1;
        getsupport(this,&local_38,psVar5);
        bVar12 = EncloseOrigin(this);
        if (bVar12) goto LAB_0090ff96;
        psVar4 = this->m_simplex;
        uVar13 = psVar4->rank - 1;
        psVar4->rank = uVar13;
        psVar5 = psVar4->c[uVar13];
        uVar13 = this->m_nfree;
        this->m_nfree = uVar13 + 1;
        this->m_free[uVar13] = psVar5;
        auVar22 = ZEXT1664(local_48);
        auVar23 = ZEXT1664(local_58);
        auVar24 = ZEXT1664(local_68);
        fVar25 = local_78;
        fVar26 = local_88;
        fVar27 = local_98;
      }
      bVar11 = 1 < uVar15;
      uVar15 = uVar15 + 1;
      if (uVar15 == 3) {
        return false;
      }
    } while( true );
  case 3:
    psVar5 = psVar4->c[0];
    psVar6 = psVar4->c[1];
    fVar1 = (psVar5->w).m_floats[0];
    fVar2 = (psVar5->w).m_floats[1];
    fVar25 = (psVar6->w).m_floats[0] - fVar1;
    fVar26 = (psVar6->w).m_floats[1] - fVar2;
    fVar3 = (psVar5->w).m_floats[2];
    fVar27 = (psVar6->w).m_floats[2] - fVar3;
    psVar5 = psVar4->c[2];
    fVar1 = (psVar5->w).m_floats[0] - fVar1;
    fVar2 = (psVar5->w).m_floats[1] - fVar2;
    fVar3 = (psVar5->w).m_floats[2] - fVar3;
    auVar17 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * fVar27)),ZEXT416((uint)fVar26),
                              ZEXT416((uint)fVar3));
    auVar20 = vfmsub231ss_fma(ZEXT416((uint)(fVar3 * fVar25)),ZEXT416((uint)fVar1),
                              ZEXT416((uint)fVar27));
    auVar17 = vinsertps_avx(auVar17,auVar20,0x10);
    auVar20 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * fVar26)),ZEXT416((uint)fVar25),
                              ZEXT416((uint)fVar2));
    local_b8.m_floats = (cbtScalar  [4])vinsertps_avx(auVar17,auVar20,0x28);
    auVar17 = vfmadd231ss_fma(ZEXT416((uint)(local_b8.m_floats[1] * local_b8.m_floats[1])),
                              ZEXT416((uint)local_b8.m_floats[0]),
                              ZEXT416((uint)local_b8.m_floats[0]));
    auVar17 = vfmadd213ss_fma(ZEXT416((uint)local_b8.m_floats[2]),
                              ZEXT416((uint)local_b8.m_floats[2]),auVar17);
    if (auVar17._0_4_ <= 0.0) {
      return false;
    }
    psVar4->p[uVar13] = 0.0;
    uVar14 = this->m_nfree - 1;
    this->m_nfree = uVar14;
    psVar5 = this->m_free[uVar14];
    psVar4->c[uVar13] = psVar5;
    psVar4->rank = uVar13 + 1;
    getsupport(this,&local_b8,psVar5);
    bVar11 = EncloseOrigin(this);
    if (!bVar11) {
      psVar4 = this->m_simplex;
      uVar13 = psVar4->rank - 1;
      psVar4->rank = uVar13;
      psVar5 = psVar4->c[uVar13];
      uVar13 = this->m_nfree;
      this->m_nfree = uVar13 + 1;
      this->m_free[uVar13] = psVar5;
      psVar4 = this->m_simplex;
      auVar20._0_4_ = -local_b8.m_floats[2];
      auVar20._4_4_ = 0x80000000;
      auVar20._8_4_ = 0x80000000;
      auVar20._12_4_ = 0x80000000;
      auVar17._0_8_ = local_b8.m_floats._0_8_ ^ 0x8000000080000000;
      auVar17._8_4_ = -local_b8.m_floats[2];
      auVar17._12_4_ = -local_b8.m_floats[3];
      local_a8.m_floats = (cbtScalar  [4])vinsertps_avx(auVar17,auVar20,0x28);
      uVar14 = psVar4->rank;
      psVar4->p[uVar14] = 0.0;
      this->m_nfree = uVar13;
      psVar4->c[uVar14] = psVar5;
      psVar4->rank = uVar14 + 1;
      getsupport(this,&local_a8,psVar5);
      bVar11 = EncloseOrigin(this);
      if (!bVar11) {
        psVar4 = this->m_simplex;
        uVar13 = psVar4->rank - 1;
        psVar4->rank = uVar13;
        psVar5 = psVar4->c[uVar13];
        uVar13 = this->m_nfree;
        this->m_nfree = uVar13 + 1;
        this->m_free[uVar13] = psVar5;
        return false;
      }
    }
    return true;
  case 4:
    psVar5 = psVar4->c[3];
    psVar6 = psVar4->c[0];
    psVar7 = psVar4->c[1];
    fVar1 = (psVar5->w).m_floats[0];
    fVar2 = (psVar5->w).m_floats[1];
    fVar25 = (psVar6->w).m_floats[0] - fVar1;
    fVar26 = (psVar6->w).m_floats[1] - fVar2;
    fVar3 = (psVar5->w).m_floats[2];
    fVar27 = (psVar6->w).m_floats[2] - fVar3;
    fVar8 = (psVar7->w).m_floats[0] - fVar1;
    fVar9 = (psVar7->w).m_floats[1] - fVar2;
    fVar10 = (psVar7->w).m_floats[2] - fVar3;
    psVar5 = psVar4->c[2];
    fVar2 = (psVar5->w).m_floats[1] - fVar2;
    auVar20 = ZEXT416((uint)((psVar5->w).m_floats[0] - fVar1));
    auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar8 * fVar2)),auVar20,
                              ZEXT416((uint)(fVar10 * fVar26)));
    auVar17 = vfnmadd213ss_fma(ZEXT416((uint)(fVar10 * fVar25)),ZEXT416((uint)fVar2),auVar17);
    auVar18 = ZEXT416((uint)((psVar5->w).m_floats[2] - fVar3));
    auVar17 = vfnmadd213ss_fma(ZEXT416((uint)(fVar8 * fVar26)),auVar18,auVar17);
    auVar17 = vfmadd213ss_fma(ZEXT416((uint)(fVar25 * fVar9)),auVar18,auVar17);
    auVar17 = vfnmadd213ss_fma(ZEXT416((uint)(fVar9 * fVar27)),auVar20,auVar17);
    if (auVar17._0_4_ == 0.0) {
      return false;
    }
    return true;
  default:
    return false;
  }
  while( true ) {
    local_b8.m_floats = (cbtScalar  [4])ZEXT816(0);
    local_b8.m_floats[uVar15] = 1.0;
    psVar4 = this->m_simplex;
    uVar13 = psVar4->rank;
    psVar4->p[uVar13] = 0.0;
    uVar14 = this->m_nfree - 1;
    this->m_nfree = uVar14;
    psVar5 = this->m_free[uVar14];
    psVar4->c[uVar13] = psVar5;
    psVar4->rank = uVar13 + 1;
    getsupport(this,&local_b8,psVar5);
    bVar12 = EncloseOrigin(this);
    if (bVar12) break;
    psVar4 = this->m_simplex;
    uVar13 = psVar4->rank - 1;
    psVar4->rank = uVar13;
    psVar5 = psVar4->c[uVar13];
    uVar13 = this->m_nfree;
    this->m_nfree = uVar13 + 1;
    this->m_free[uVar13] = psVar5;
    psVar4 = this->m_simplex;
    auVar16._0_4_ = -local_b8.m_floats[2];
    auVar16._4_4_ = 0x80000000;
    auVar16._8_4_ = 0x80000000;
    auVar16._12_4_ = 0x80000000;
    auVar19._0_8_ = local_b8.m_floats._0_8_ ^ 0x8000000080000000;
    auVar19._8_4_ = -local_b8.m_floats[2];
    auVar19._12_4_ = -local_b8.m_floats[3];
    local_a8.m_floats = (cbtScalar  [4])vinsertps_avx(auVar19,auVar16,0x28);
    uVar14 = psVar4->rank;
    psVar4->p[uVar14] = 0.0;
    this->m_nfree = uVar13;
    psVar4->c[uVar14] = psVar5;
    psVar4->rank = uVar14 + 1;
    getsupport(this,&local_a8,psVar5);
    bVar12 = EncloseOrigin(this);
    if (bVar12) break;
    psVar4 = this->m_simplex;
    uVar13 = psVar4->rank - 1;
    psVar4->rank = uVar13;
    psVar5 = psVar4->c[uVar13];
    uVar13 = this->m_nfree;
    this->m_nfree = uVar13 + 1;
    this->m_free[uVar13] = psVar5;
    bVar11 = 1 < uVar15;
    uVar15 = uVar15 + 1;
    if (uVar15 == 3) {
      return false;
    }
  }
LAB_0090ff96:
  if (bVar11) {
    return false;
  }
  return true;
}

Assistant:

bool EncloseOrigin()
	{
		switch (m_simplex->rank)
		{
			case 1:
			{
				for (U i = 0; i < 3; ++i)
				{
					cbtVector3 axis = cbtVector3(0, 0, 0);
					axis[i] = 1;
					appendvertice(*m_simplex, axis);
					if (EncloseOrigin()) return (true);
					removevertice(*m_simplex);
					appendvertice(*m_simplex, -axis);
					if (EncloseOrigin()) return (true);
					removevertice(*m_simplex);
				}
			}
			break;
			case 2:
			{
				const cbtVector3 d = m_simplex->c[1]->w - m_simplex->c[0]->w;
				for (U i = 0; i < 3; ++i)
				{
					cbtVector3 axis = cbtVector3(0, 0, 0);
					axis[i] = 1;
					const cbtVector3 p = cbtCross(d, axis);
					if (p.length2() > 0)
					{
						appendvertice(*m_simplex, p);
						if (EncloseOrigin()) return (true);
						removevertice(*m_simplex);
						appendvertice(*m_simplex, -p);
						if (EncloseOrigin()) return (true);
						removevertice(*m_simplex);
					}
				}
			}
			break;
			case 3:
			{
				const cbtVector3 n = cbtCross(m_simplex->c[1]->w - m_simplex->c[0]->w,
											m_simplex->c[2]->w - m_simplex->c[0]->w);
				if (n.length2() > 0)
				{
					appendvertice(*m_simplex, n);
					if (EncloseOrigin()) return (true);
					removevertice(*m_simplex);
					appendvertice(*m_simplex, -n);
					if (EncloseOrigin()) return (true);
					removevertice(*m_simplex);
				}
			}
			break;
			case 4:
			{
				if (cbtFabs(det(m_simplex->c[0]->w - m_simplex->c[3]->w,
							   m_simplex->c[1]->w - m_simplex->c[3]->w,
							   m_simplex->c[2]->w - m_simplex->c[3]->w)) > 0)
					return (true);
			}
			break;
		}
		return (false);
	}